

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O3

void * sx__malloc_cb(void *ptr,size_t size,uint32_t align,char *file,char *func,uint32_t line,
                    void *user_data)

{
  uint uVar1;
  code *pcVar2;
  void *pvVar3;
  uint8_t *aligned;
  size_t sVar4;
  anon_union_8_2_61bd4320 un;
  anon_union_8_2_61bd4320 un_1;
  ulong uVar5;
  void *pvVar6;
  
  if (size == 0) {
    if (ptr != (void *)0x0) {
      if (8 < align) {
        ptr = (void *)((long)ptr - (ulong)*(uint *)((long)ptr + -4));
      }
      free(ptr);
    }
    return (void *)0x0;
  }
  if (ptr != (void *)0x0) {
    if (align < 9) {
      pvVar3 = realloc(ptr,size);
      return pvVar3;
    }
    uVar1 = *(uint *)((long)ptr + -4);
    pvVar3 = (void *)((long)ptr - (ulong)uVar1);
    uVar5 = 8;
    if (8 < (int)align) {
      uVar5 = (ulong)align;
    }
    sVar4 = size + uVar5 + 4;
    if (sVar4 == 0) {
      free(pvVar3);
    }
    else {
      pvVar3 = realloc(pvVar3,sVar4);
      if (pvVar3 != (void *)0x0) {
        uVar5 = (ulong)((int)uVar5 - 1);
        pvVar6 = (void *)(~uVar5 & (long)pvVar3 + uVar5 + 4);
        if (pvVar6 == ptr) {
          return ptr;
        }
        memmove(pvVar6,(void *)((ulong)uVar1 + (long)pvVar3),size);
        *(int *)((long)pvVar6 + -4) = (int)pvVar6 - (int)pvVar3;
        return pvVar6;
      }
    }
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                      ,0xcd,"ptr");
    pcVar2 = (code *)swi(3);
    pvVar3 = (void *)(*pcVar2)();
    return pvVar3;
  }
  if (align < 9) {
    pvVar3 = malloc(size);
    return pvVar3;
  }
  uVar5 = 8;
  if (8 < (int)align) {
    uVar5 = (ulong)align;
  }
  sVar4 = size + uVar5 + 4;
  if ((sVar4 != 0) && (pvVar3 = malloc(sVar4), pvVar3 != (void *)0x0)) {
    uVar5 = (ulong)((int)uVar5 - 1);
    pvVar6 = (void *)(~uVar5 & (long)pvVar3 + uVar5 + 4);
    *(int *)((long)pvVar6 + -4) = (int)pvVar6 - (int)pvVar3;
    return pvVar6;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                    ,0xb0,"ptr");
  pcVar2 = (code *)swi(3);
  pvVar3 = (void *)(*pcVar2)();
  return pvVar3;
}

Assistant:

static void* sx__malloc_cb(void* ptr, size_t size, uint32_t align, const char* file,
                           const char* func, uint32_t line, void* user_data)
{
    sx_unused(user_data);
    sx_unused(line);
    sx_unused(func);
    sx_unused(file);

    if (size == 0) {
        if (ptr) {
            if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT) {
                free(ptr);
                return NULL;
            }

#if SX_COMPILER_MSVC
            _aligned_free(ptr);
#else
            sx__aligned_free(&g_alloc_malloc, ptr, file, func, line);
#endif
        }
        return NULL;
    } else if (ptr == NULL) {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return malloc(size);

#if SX_COMPILER_MSVC
        return _aligned_malloc(size, align);
#else
        return sx__aligned_alloc(&g_alloc_malloc, size, align, file, func, line);
#endif
    } else {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return realloc(ptr, size);

#if SX_COMPILER_MSVC
        return _aligned_realloc(ptr, size, align);
#else
        return sx__aligned_realloc(&g_alloc_malloc, ptr, size, align, file, func, line);
#endif
    }
}